

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lyplg_ext_cfree_instance_substatements(ly_ctx *ctx,lysc_ext_substmt *substmts)

{
  ushort uVar1;
  ly_stmt lVar2;
  lysc_when **w;
  lysc_node *plVar3;
  lysc_ext_instance *plVar4;
  void **ppvVar5;
  void *pvVar6;
  lysc_node *node;
  lysc_ext_instance *plVar7;
  void **ppvVar8;
  uint64_t c__;
  void *pvVar9;
  lysf_ctx fctx;
  lysf_ctx local_58;
  
  local_58.mod = (lys_module *)0x0;
  local_58.ext_set.size = 0;
  local_58.ext_set.count = 0;
  local_58.ext_set.field_2.dnodes = (lyd_node **)0x0;
  ppvVar8 = (void **)0x0;
  local_58.ctx = ctx;
  do {
    if (substmts == (lysc_ext_substmt *)0x0) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = substmts[-1].storage_p;
    }
    if (ppvVar5 <= ppvVar8) {
      if (substmts != (lysc_ext_substmt *)0x0) {
        free(&substmts[-1].storage_p);
      }
      return;
    }
    w = (lysc_when **)substmts[(long)ppvVar8].storage_p;
    if (w == (lysc_when **)0x0) goto LAB_00161a3f;
    lVar2 = substmts[(long)ppvVar8].stmt;
    if ((int)lVar2 < 0x130000) {
      if ((int)lVar2 < 0x20000) {
        if ((int)lVar2 < 0x100) {
          if ((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
             ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0))
          goto LAB_001615b7;
          if (lVar2 != LY_STMT_AUGMENT) goto LAB_00161997;
          goto LAB_00161a3f;
        }
        if ((int)lVar2 < 0x1000) {
          if ((int)lVar2 < 0x400) {
            if ((lVar2 == LY_STMT_CASE) || (lVar2 == LY_STMT_CHOICE)) goto LAB_001615b7;
          }
          else {
            if (lVar2 == LY_STMT_CONTAINER) goto LAB_001615b7;
            if (lVar2 == LY_STMT_GROUPING) goto LAB_00161a3f;
          }
        }
        else if ((int)lVar2 < 0x4000) {
          if ((lVar2 == LY_STMT_LEAF) || (lVar2 == LY_STMT_LEAF_LIST)) goto LAB_001615b7;
        }
        else {
          if (lVar2 == LY_STMT_LIST) {
LAB_001615b7:
            plVar3 = (lysc_node *)*w;
            while (node = plVar3, node != (lysc_node *)0x0) {
              plVar3 = node->next;
              uVar1 = node->nodetype;
              lysc_node_free_(&local_58,node);
              if ((uVar1 & 0x3000) != 0) {
                free(node);
              }
            }
            *substmts[(long)ppvVar8].storage_p = (void *)0x0;
            goto LAB_00161a3f;
          }
          if (lVar2 == LY_STMT_USES) goto LAB_00161a3f;
          if (lVar2 == LY_STMT_ARGUMENT) goto LAB_00161921;
        }
LAB_00161997:
        ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
               ,0x6a2);
      }
      else if ((int)lVar2 < 0xa0000) {
        if ((int)lVar2 < 0x60000) {
          if ((int)lVar2 < 0x40000) {
            if ((lVar2 != LY_STMT_BASE) && (lVar2 != LY_STMT_BELONGS_TO)) goto LAB_00161997;
          }
          else {
            if (lVar2 == LY_STMT_BIT) {
LAB_00161945:
              plVar4 = (lysc_ext_instance *)*w;
              pvVar9 = (void *)0x0;
              plVar7 = plVar4;
              while( true ) {
                if (plVar4 == (lysc_ext_instance *)0x0) {
                  pvVar6 = (void *)0x0;
                }
                else {
                  pvVar6 = plVar4[-1].compiled;
                }
                if (pvVar6 <= pvVar9) break;
                lysc_enum_item_free(&local_58,(lysc_type_bitenum_item *)plVar7);
                pvVar9 = (void *)((long)pvVar9 + 1);
                plVar7 = (lysc_ext_instance *)&plVar7->parent_stmt;
              }
              goto joined_r0x0016197a;
            }
            if (lVar2 != LY_STMT_CONFIG) goto LAB_00161997;
          }
        }
        else if ((int)lVar2 < 0x80000) {
          if (lVar2 == LY_STMT_CONTACT) goto LAB_00161921;
          if (lVar2 != LY_STMT_DEFAULT) goto LAB_00161997;
        }
        else {
          if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_00161921;
          if (lVar2 != LY_STMT_DEVIATE) goto LAB_00161997;
        }
      }
      else {
        if ((int)lVar2 < 0xe0000) {
          if ((int)lVar2 < 0xc0000) {
            if (lVar2 == LY_STMT_DEVIATION) goto LAB_00161a3f;
            if (lVar2 == LY_STMT_ENUM) goto LAB_00161945;
          }
          else if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE))
          goto LAB_00161921;
          goto LAB_00161997;
        }
        if ((int)lVar2 < 0x100000) {
          if (lVar2 != LY_STMT_EXTENSION) {
            if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
              plVar4 = (lysc_ext_instance *)*w;
              pvVar9 = (void *)0x0;
              plVar7 = plVar4;
              while( true ) {
                if (plVar4 == (lysc_ext_instance *)0x0) {
                  pvVar6 = (void *)0x0;
                }
                else {
                  pvVar6 = plVar4[-1].compiled;
                }
                if (pvVar6 <= pvVar9) break;
                lysc_ext_instance_free(&local_58,plVar7);
                pvVar9 = (void *)((long)pvVar9 + 1);
                plVar7 = plVar7 + 1;
              }
              goto joined_r0x0016197a;
            }
            goto LAB_00161997;
          }
        }
        else if ((lVar2 != LY_STMT_FEATURE) && (lVar2 != LY_STMT_FRACTION_DIGITS)) {
          if (lVar2 != LY_STMT_IDENTITY) goto LAB_00161997;
          plVar4 = (lysc_ext_instance *)*w;
          pvVar9 = (void *)0x0;
          plVar7 = plVar4;
          while( true ) {
            if (plVar4 == (lysc_ext_instance *)0x0) {
              pvVar6 = (void *)0x0;
            }
            else {
              pvVar6 = plVar4[-1].compiled;
            }
            if (pvVar6 <= pvVar9) break;
            lysc_ident_free(&local_58,(lysc_ident *)plVar7);
            pvVar9 = (void *)((long)pvVar9 + 1);
            plVar7 = (lysc_ext_instance *)&plVar7->substmts;
          }
joined_r0x0016197a:
          if (plVar4 != (lysc_ext_instance *)0x0) {
            free(&plVar4[-1].compiled);
          }
        }
      }
    }
    else if ((int)lVar2 < 0x240000) {
      if ((int)lVar2 < 0x1b0000) {
        if ((int)lVar2 < 0x170000) {
          if ((int)lVar2 < 0x150000) {
            if ((lVar2 != LY_STMT_IF_FEATURE) && (lVar2 != LY_STMT_IMPORT)) goto LAB_00161997;
          }
          else if (lVar2 != LY_STMT_INCLUDE) {
            if (lVar2 == LY_STMT_KEY) goto LAB_00161921;
            goto LAB_00161997;
          }
        }
        else if ((int)lVar2 < 0x190000) {
          if (lVar2 == LY_STMT_LENGTH) goto LAB_00161933;
          if (lVar2 != LY_STMT_MANDATORY) goto LAB_00161997;
        }
        else if ((lVar2 != LY_STMT_MAX_ELEMENTS) && (lVar2 != LY_STMT_MIN_ELEMENTS))
        goto LAB_00161997;
      }
      else if ((int)lVar2 < 0x1f0000) {
        if ((int)lVar2 < 0x1d0000) {
          if (lVar2 != LY_STMT_MODIFIER) {
            if (lVar2 != LY_STMT_MODULE) goto LAB_00161997;
            goto LAB_00161a3f;
          }
        }
        else {
          if (lVar2 == LY_STMT_MUST) {
            plVar4 = (lysc_ext_instance *)*w;
            pvVar9 = (void *)0x0;
            plVar7 = plVar4;
            while( true ) {
              if (plVar4 == (lysc_ext_instance *)0x0) {
                pvVar6 = (void *)0x0;
              }
              else {
                pvVar6 = plVar4[-1].compiled;
              }
              if (pvVar6 <= pvVar9) break;
              lysc_must_free(&local_58,(lysc_must *)plVar7);
              pvVar9 = (void *)((long)pvVar9 + 1);
              plVar7 = (lysc_ext_instance *)&plVar7->substmts;
            }
            goto joined_r0x0016197a;
          }
          if (lVar2 != LY_STMT_NAMESPACE) goto LAB_00161997;
        }
LAB_00161921:
        lydict_remove(ctx,(char *)*w);
      }
      else if ((int)lVar2 < 0x210000) {
        if (lVar2 != LY_STMT_ORDERED_BY) {
          if (lVar2 != LY_STMT_ORGANIZATION) goto LAB_00161997;
          goto LAB_00161921;
        }
      }
      else if (lVar2 != LY_STMT_PATH) {
        if (lVar2 == LY_STMT_PATTERN) {
          plVar4 = (lysc_ext_instance *)*w;
          pvVar9 = (void *)0x0;
          plVar7 = plVar4;
          while( true ) {
            if (plVar4 == (lysc_ext_instance *)0x0) {
              pvVar6 = (void *)0x0;
            }
            else {
              pvVar6 = plVar4[-1].compiled;
            }
            if (pvVar6 <= pvVar9) break;
            lysc_pattern_free(&local_58,(lysc_pattern **)plVar7);
            pvVar9 = (void *)((long)pvVar9 + 1);
            plVar7 = (lysc_ext_instance *)&plVar7->argument;
          }
          goto joined_r0x0016197a;
        }
        if (lVar2 != LY_STMT_POSITION) goto LAB_00161997;
      }
    }
    else {
      if (0x2cffff < (int)lVar2) {
        if ((int)lVar2 < 0x310000) {
          if ((int)lVar2 < 0x2f0000) {
            if (lVar2 != LY_STMT_SUBMODULE) {
              if (lVar2 != LY_STMT_TYPE) goto LAB_00161997;
              lysc_type_free(&local_58,(lysc_type *)*w);
            }
          }
          else if ((lVar2 != LY_STMT_TYPEDEF) && (lVar2 != LY_STMT_UNIQUE)) goto LAB_00161997;
        }
        else if ((int)lVar2 < 0x330000) {
          if (lVar2 == LY_STMT_UNITS) goto LAB_00161921;
          if (lVar2 != LY_STMT_VALUE) goto LAB_00161997;
        }
        else if (lVar2 == LY_STMT_WHEN) {
          lysc_when_free(&local_58,w);
        }
        else if ((lVar2 != LY_STMT_YANG_VERSION) && (lVar2 != LY_STMT_YIN_ELEMENT))
        goto LAB_00161997;
        goto LAB_00161a3f;
      }
      if ((int)lVar2 < 0x280000) {
        if ((int)lVar2 < 0x260000) {
          if (lVar2 != LY_STMT_PREFIX) {
            if (lVar2 == LY_STMT_PRESENCE) goto LAB_00161921;
            goto LAB_00161997;
          }
        }
        else {
          if (lVar2 != LY_STMT_RANGE) {
            if (lVar2 == LY_STMT_REFERENCE) goto LAB_00161921;
            goto LAB_00161997;
          }
LAB_00161933:
          lysc_range_free(&local_58,(lysc_range *)*w);
        }
      }
      else if ((int)lVar2 < 0x2a0000) {
        if ((lVar2 != LY_STMT_REFINE) && (lVar2 != LY_STMT_REQUIRE_INSTANCE)) goto LAB_00161997;
      }
      else if ((lVar2 != LY_STMT_REVISION) &&
              ((lVar2 != LY_STMT_REVISION_DATE && (lVar2 != LY_STMT_STATUS)))) goto LAB_00161997;
    }
LAB_00161a3f:
    ppvVar8 = (void **)((long)ppvVar8 + 1);
  } while( true );
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_cfree_instance_substatements(const struct ly_ctx *ctx, struct lysc_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST: {
            struct lysc_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysc_node_free_(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_USES:
        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_UNITS: {
            /* single item */
            const char *str = *substmts[u].storage_p;

            lydict_remove(ctx, str);
            break;
        }
        case LY_STMT_BIT:
        case LY_STMT_ENUM: {
            /* sized array */
            struct lysc_type_bitenum_item *items = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, items, lysc_enum_item_free);
            break;
        }
        case LY_STMT_LENGTH:
        case LY_STMT_RANGE: {
            /* single item */
            struct lysc_range *range = *substmts[u].storage_p;

            lysc_range_free(&fctx, range);
            break;
        }
        case LY_STMT_MUST: {
            /* sized array */
            struct lysc_must *musts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, musts, lysc_must_free);
            break;
        }
        case LY_STMT_WHEN:
            /* single item, expects a pointer */
            lysc_when_free(&fctx, (struct lysc_when **)substmts[u].storage_p);
            break;

        case LY_STMT_PATTERN: {
            /* sized array of pointers */
            struct lysc_pattern **patterns = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, patterns, lysc_pattern_free);
            break;
        }
        case LY_STMT_TYPE: {
            /* single item */
            struct lysc_type *type = *substmts[u].storage_p;

            lysc_type_free(&fctx, type);
            break;
        }
        case LY_STMT_IDENTITY: {
            /* sized array */
            struct lysc_ident *idents = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, idents, lysc_ident_free);
            break;
        }
        case LY_STMT_EXTENSION_INSTANCE: {
            /* sized array */
            struct lysc_ext_instance *exts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, exts, lysc_ext_instance_free);
            break;
        }
        case LY_STMT_AUGMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_DEFAULT:
        case LY_STMT_DEVIATE:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_IMPORT:
        case LY_STMT_INCLUDE:
        case LY_STMT_MODULE:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_REFINE:
        case LY_STMT_REVISION:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_SUBMODULE:
        case LY_STMT_TYPEDEF:
        case LY_STMT_UNIQUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* it is not possible to compile these statements */
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}